

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

NULLCArray NULLC::AllocArray(uint size,uint count,uint type)

{
  NULLCArray NVar1;
  ExternTypeInfo *pEVar2;
  void *pvVar3;
  uint local_54;
  markerType *marker;
  char *ptr;
  uint bytes;
  uint arrayPadding;
  ExternTypeInfo *typeInfo;
  uint type_local;
  uint count_local;
  uint size_local;
  NULLCArray ret;
  
  ret.ptr._0_4_ = 0;
  _count_local = (char *)0x0;
  if ((ulong)size * (ulong)count < (ulong)globalMemoryLimit ||
      (ulong)size * (ulong)count - (ulong)globalMemoryLimit == 0) {
    pEVar2 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),type);
    if (pEVar2->defaultAlign < 5) {
      local_54 = 4;
    }
    else {
      local_54 = (uint)pEVar2->defaultAlign;
    }
    ptr._0_4_ = count * size;
    if ((int)ptr == 0) {
      ptr._0_4_ = 4;
    }
    pvVar3 = AllocObject((int)ptr + local_54,type);
    if (pvVar3 != (void *)0x0) {
      _count_local = (char *)((long)pvVar3 + (ulong)local_54);
      *(uint *)(_count_local + -4) = count;
      *(ulong *)((long)pvVar3 + -8) = OBJECT_ARRAY | *(ulong *)((long)pvVar3 + -8);
      ret.ptr._0_4_ = count;
    }
  }
  else {
    nullcThrowError("ERROR: can\'t allocate array with %u elements of size %u",(ulong)count,
                    (ulong)size);
  }
  NVar1.len = (uint)ret.ptr;
  NVar1.ptr = _count_local;
  return NVar1;
}

Assistant:

NULLCArray NULLC::AllocArray(unsigned size, unsigned count, unsigned type)
{
	NULLCArray ret;

	ret.len = 0;
	ret.ptr = NULL;

	if((unsigned long long)size * count > globalMemoryLimit)
	{
		nullcThrowError("ERROR: can't allocate array with %u elements of size %u", count, size);
		return ret;
	}

	ExternTypeInfo &typeInfo = NULLC::linker->exTypes[type];

	unsigned arrayPadding = typeInfo.defaultAlign > 4 ? typeInfo.defaultAlign : 4;

	unsigned bytes = count * size;
	
	if(bytes == 0)
		bytes += 4;

	char *ptr = (char*)AllocObject(bytes + arrayPadding, type);

	if(!ptr)
		return ret;

	ret.len = count;
	ret.ptr = arrayPadding + ptr;

	((unsigned*)ret.ptr)[-1] = count;

	markerType *marker = (markerType*)(ptr - sizeof(markerType));
	*marker |= OBJECT_ARRAY;

	return ret;
}